

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

void __thiscall icu_63::FixedDecimal::FixedDecimal(FixedDecimal *this,FixedDecimal *other)

{
  int64_t iVar1;
  UBool UVar2;
  UBool UVar3;
  UBool UVar4;
  
  (this->super_IFixedDecimal)._vptr_IFixedDecimal = (_func_int **)&PTR__FixedDecimal_003b3c90;
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__FixedDecimal_003b3cd0;
  this->source = other->source;
  this->visibleDecimalDigitCount = other->visibleDecimalDigitCount;
  iVar1 = other->decimalDigitsWithoutTrailingZeros;
  this->decimalDigits = other->decimalDigits;
  this->decimalDigitsWithoutTrailingZeros = iVar1;
  this->intValue = other->intValue;
  UVar2 = other->isNegative;
  UVar3 = other->_isNaN;
  UVar4 = other->_isInfinite;
  this->_hasIntegerValue = other->_hasIntegerValue;
  this->isNegative = UVar2;
  this->_isNaN = UVar3;
  this->_isInfinite = UVar4;
  return;
}

Assistant:

FixedDecimal::FixedDecimal(const FixedDecimal &other) {
    source = other.source;
    visibleDecimalDigitCount = other.visibleDecimalDigitCount;
    decimalDigits = other.decimalDigits;
    decimalDigitsWithoutTrailingZeros = other.decimalDigitsWithoutTrailingZeros;
    intValue = other.intValue;
    _hasIntegerValue = other._hasIntegerValue;
    isNegative = other.isNegative;
    _isNaN = other._isNaN;
    _isInfinite = other._isInfinite;
}